

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O1

void __thiscall CJSON::AddPair<long_long>(CJSON *this,string *Name,longlong *val)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  iterator iVar4;
  mapped_type *this_00;
  CJSONException *this_01;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  uint __len;
  ulong __val;
  string __str;
  string local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (CJSONException *)__cxa_allocate_exception(0x30);
    std::operator+(&local_50,"Name \'",Name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_78._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_78._M_dataplus._M_p == psVar7) {
      local_78.field_2._M_allocated_capacity = *psVar7;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar7;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    CJSONException::CJSONException(this_01,&local_78,NAME_ALREADY_EXITS);
    __cxa_throw(this_01,&CJSONException::typeinfo,CJSONException::~CJSONException);
  }
  uVar1 = *val;
  __val = -uVar1;
  if (0 < (long)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00120153;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00120153;
      }
      if (uVar6 < 10000) goto LAB_00120153;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00120153:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = Name;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)((long)uVar1 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_78._M_dataplus._M_p + -((long)uVar1 >> 0x3f),__len,__val);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_Values,local_58);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void AddPair(const std::string &Name, const T &val)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);

            m_Values[Name] = ValueToString(val); 
        }